

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::write_to_file
               (char *pFilename,image_u8 *img,uint write_flags,int grayscale_comp_index)

{
  bool bVar1;
  uchar uVar2;
  uint uVar3;
  component_flags cVar4;
  int iVar5;
  uint uVar6;
  color_quad<unsigned_char,_int> *pcVar7;
  code *local_1c8;
  bool local_e2;
  undefined1 local_d4 [8];
  params params;
  void *pPNG_image_data;
  size_t png_image_size;
  bool success;
  uchar *puStack_b0;
  color_quad_u8 c;
  uint8 *pDst_1;
  color_quad_u8 *pSrc_end_1;
  color_quad_u8 *pSrc_1;
  uchar *puStack_90;
  uint y_1;
  uint8 *pDst;
  color_quad_u8 *pSrc_end;
  color_quad_u8 *pSrc;
  color_quad<unsigned_char,_int> *pcStack_70;
  uint y;
  void *pSrc_img;
  undefined1 local_60 [4];
  uint num_src_chans;
  vector<unsigned_char> temp;
  bool local_39;
  undefined1 local_38 [7];
  bool is_jpeg;
  dynamic_string ext;
  int grayscale_comp_index_local;
  uint write_flags_local;
  image_u8 *img_local;
  char *pFilename_local;
  
  if ((grayscale_comp_index < -1) || (3 < grayscale_comp_index)) {
    return false;
  }
  ext.m_pStr._0_4_ = grayscale_comp_index;
  ext.m_pStr._4_4_ = write_flags;
  uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
  if (uVar3 == 0) {
    return false;
  }
  dynamic_string::dynamic_string((dynamic_string *)local_38,pFilename);
  local_39 = false;
  bVar1 = file_utils::get_extension((dynamic_string *)local_38);
  if (bVar1) {
    bVar1 = dynamic_string::operator==((dynamic_string *)local_38,"jpg");
    local_e2 = true;
    if (!bVar1) {
      local_e2 = dynamic_string::operator==((dynamic_string *)local_38,"jpeg");
    }
    local_39 = local_e2;
    bVar1 = dynamic_string::operator!=((dynamic_string *)local_38,"png");
    if ((((bVar1) && (bVar1 = dynamic_string::operator!=((dynamic_string *)local_38,"bmp"), bVar1))
        && (bVar1 = dynamic_string::operator!=((dynamic_string *)local_38,"tga"), bVar1)) &&
       (local_e2 == false)) {
      console::error(
                    "crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n"
                    );
      pFilename_local._7_1_ = false;
      temp.m_size = 1;
      goto LAB_001296a8;
    }
  }
  vector<unsigned_char>::vector((vector<unsigned_char> *)local_60);
  if (local_39 != false) {
    ext.m_pStr._4_4_ = ext.m_pStr._4_4_ | 1;
  }
  cVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(img);
  if (((cVar4 & cCompFlagGrayscale) == 0) && ((ext.m_pStr._4_4_ & 2) == 0)) {
    bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid(img,3);
    if ((bVar1) && ((ext.m_pStr._4_4_ & 1) == 0)) {
      pSrc_img._4_4_ = 4;
      pcStack_70 = image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(img);
    }
    else {
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_total_pixels(img);
      vector<unsigned_char>::resize((vector<unsigned_char> *)local_60,uVar3 * 3,false);
      for (pSrc_1._4_4_ = 0; uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img)
          , pSrc_1._4_4_ < uVar3; pSrc_1._4_4_ = pSrc_1._4_4_ + 1) {
        pcVar7 = image<crnlib::color_quad<unsigned_char,_int>_>::get_scanline(img,pSrc_1._4_4_);
        uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
        uVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
        puStack_b0 = vector<unsigned_char>::operator[]
                               ((vector<unsigned_char> *)local_60,pSrc_1._4_4_ * uVar6 * 3);
        pSrc_end_1 = pcVar7;
        while (pSrc_end_1 != pcVar7 + uVar3) {
          color_quad<unsigned_char,_int>::color_quad
                    ((color_quad<unsigned_char,_int> *)((long)&png_image_size + 4),pSrc_end_1);
          *puStack_b0 = png_image_size._4_1_;
          puStack_b0[1] = png_image_size._5_1_;
          puStack_b0[2] = png_image_size._6_1_;
          puStack_b0 = puStack_b0 + 3;
          pSrc_end_1 = pSrc_end_1 + 1;
        }
      }
      pSrc_img._4_4_ = 3;
      pcStack_70 = (color_quad<unsigned_char,_int> *)
                   vector<unsigned_char>::operator[]((vector<unsigned_char> *)local_60,0);
    }
  }
  else {
    if (3 < (int)(uint)ext.m_pStr) {
      ext.m_pStr._0_4_ = 3;
    }
    uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_total_pixels(img);
    vector<unsigned_char>::resize((vector<unsigned_char> *)local_60,uVar3,false);
    for (pSrc._4_4_ = 0; uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img),
        pSrc._4_4_ < uVar3; pSrc._4_4_ = pSrc._4_4_ + 1) {
      pSrc_end = image<crnlib::color_quad<unsigned_char,_int>_>::get_scanline(img,pSrc._4_4_);
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
      pcVar7 = pSrc_end + uVar3;
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
      puStack_90 = vector<unsigned_char>::operator[]
                             ((vector<unsigned_char> *)local_60,pSrc._4_4_ * uVar3);
      cVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(img);
      if ((cVar4 & cCompFlagGrayscale) == 0) {
        if ((int)(uint)ext.m_pStr < 0) {
          while (pSrc_end != pcVar7) {
            iVar5 = color_quad<unsigned_char,_int>::get_luma(pSrc_end);
            *puStack_90 = (uchar)iVar5;
            puStack_90 = puStack_90 + 1;
            pSrc_end = pSrc_end + 1;
          }
        }
        else {
          while (pSrc_end != pcVar7) {
            uVar2 = color_quad<unsigned_char,_int>::operator[](pSrc_end,(uint)ext.m_pStr);
            *puStack_90 = uVar2;
            puStack_90 = puStack_90 + 1;
            pSrc_end = pSrc_end + 1;
          }
        }
      }
      else {
        while (pSrc_end != pcVar7) {
          uVar2 = color_quad<unsigned_char,_int>::operator[](pSrc_end,1);
          *puStack_90 = uVar2;
          puStack_90 = puStack_90 + 1;
          pSrc_end = pSrc_end + 1;
        }
      }
    }
    pcStack_70 = (color_quad<unsigned_char,_int> *)
                 vector<unsigned_char>::operator[]((vector<unsigned_char> *)local_60,0);
    pSrc_img._4_4_ = 1;
  }
  png_image_size._3_1_ = 0;
  bVar1 = dynamic_string::operator==((dynamic_string *)local_38,"png");
  if (bVar1) {
    pPNG_image_data = (void *)0x0;
    uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
    uVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img);
    params._4_8_ = tdefl_write_image_to_png_file_in_memory
                             (pcStack_70,uVar3,uVar6,pSrc_img._4_4_,(size_t *)&pPNG_image_data);
    if ((void *)params._4_8_ != (void *)0x0) {
      png_image_size._3_1_ =
           file_utils::write_buf_to_file(pFilename,(void *)params._4_8_,(size_t)pPNG_image_data);
      mz_free((void *)params._4_8_);
      goto LAB_0012968d;
    }
    pFilename_local._7_1_ = false;
  }
  else {
    if (local_39 == false) {
      bVar1 = dynamic_string::operator==((dynamic_string *)local_38,"bmp");
      if (bVar1) {
        local_1c8 = stbi_write_bmp;
      }
      else {
        local_1c8 = stbi_write_tga;
      }
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
      uVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img);
      iVar5 = (*local_1c8)(pFilename,uVar3,uVar6,pSrc_img._4_4_,pcStack_70);
      png_image_size._3_1_ = iVar5 == 1;
    }
    else {
      jpge::params::params((params *)local_d4);
      if ((ext.m_pStr._4_4_ & 0xff000000) != 0) {
        local_d4._0_4_ = math::clamp<unsigned_int>(ext.m_pStr._4_4_ >> 0x18,1,100);
      }
      params.m_quality._1_1_ = (ext.m_pStr._4_4_ & 0x80000) != 0;
      params.m_quality._0_1_ = (ext.m_pStr._4_4_ & 0x100000) != 0;
      if ((ext.m_pStr._4_4_ & 0x10000) == 0) {
        if ((ext.m_pStr._4_4_ & 0x20000) == 0) {
          if ((ext.m_pStr._4_4_ & 0x40000) != 0) {
            local_d4._4_4_ = H2V2;
          }
        }
        else {
          local_d4._4_4_ = H2V1;
        }
      }
      else {
        local_d4._4_4_ = H1V1;
      }
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
      uVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img);
      png_image_size._3_1_ =
           jpge::compress_image_to_jpeg_file
                     (pFilename,uVar3,uVar6,pSrc_img._4_4_,(uint8 *)pcStack_70,(params *)local_d4);
    }
LAB_0012968d:
    pFilename_local._7_1_ = (bool)(png_image_size._3_1_ & 1);
  }
  temp.m_size = 1;
  vector<unsigned_char>::~vector((vector<unsigned_char> *)local_60);
LAB_001296a8:
  dynamic_string::~dynamic_string((dynamic_string *)local_38);
  return pFilename_local._7_1_;
}

Assistant:

bool write_to_file(const char* pFilename, const image_u8& img, uint write_flags, int grayscale_comp_index)
        {
            if ((grayscale_comp_index < -1) || (grayscale_comp_index > 3))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (!img.get_width())
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            dynamic_string ext(pFilename);
            bool is_jpeg = false;
            if (file_utils::get_extension(ext))
            {
                is_jpeg = ((ext == "jpg") || (ext == "jpeg"));

                if ((ext != "png") && (ext != "bmp") && (ext != "tga") && (!is_jpeg))
                {
                    console::error("crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n");
                    return false;
                }
            }

            crnlib::vector<uint8> temp;
            uint num_src_chans = 0;
            const void* pSrc_img = nullptr;

            if (is_jpeg)
            {
                write_flags |= cWriteFlagIgnoreAlpha;
            }

            if ((img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale) || (write_flags & image_utils::cWriteFlagGrayscale))
            {
                CRNLIB_ASSERT(grayscale_comp_index < 4);
                if (grayscale_comp_index > 3)
                {
                    grayscale_comp_index = 3;
                }

                temp.resize(img.get_total_pixels());

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width()];

                    if (img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[1];
                        }
                    }
                    else if (grayscale_comp_index < 0)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = static_cast<uint8>((*pSrc++).get_luma());
                        }
                    }
                    else
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[grayscale_comp_index];
                        }
                    }
                }

                pSrc_img = &temp[0];
                num_src_chans = 1;
            }
            else if ((!img.is_component_valid(3)) || (write_flags & cWriteFlagIgnoreAlpha))
            {
                temp.resize(img.get_total_pixels() * 3);

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width() * 3];

                    while (pSrc != pSrc_end)
                    {
                        const color_quad_u8 c(*pSrc++);

                        pDst[0] = c.r;
                        pDst[1] = c.g;
                        pDst[2] = c.b;

                        pDst += 3;
                    }
                }

                num_src_chans = 3;
                pSrc_img = &temp[0];
            }
            else
            {
                num_src_chans = 4;
                pSrc_img = img.get_ptr();
            }

            bool success = false;
            if (ext == "png")
            {
                size_t png_image_size = 0;
                void* pPNG_image_data = tdefl_write_image_to_png_file_in_memory(pSrc_img, img.get_width(), img.get_height(), num_src_chans, &png_image_size);
                if (!pPNG_image_data)
                {
                    return false;
                }
                success = file_utils::write_buf_to_file(pFilename, pPNG_image_data, png_image_size);
                mz_free(pPNG_image_data);
            }
            else if (is_jpeg)
            {
                jpge::params params;
                if (write_flags & cWriteFlagJPEGQualityLevelMask)
                {
                    params.m_quality = math::clamp<uint>((write_flags & cWriteFlagJPEGQualityLevelMask) >> cWriteFlagJPEGQualityLevelShift, 1U, 100U);
                }
                params.m_two_pass_flag = (write_flags & cWriteFlagJPEGTwoPass) != 0;
                params.m_no_chroma_discrim_flag = (write_flags & cWriteFlagJPEGNoChromaDiscrim) != 0;

                if (write_flags & cWriteFlagJPEGH1V1)
                {
                    params.m_subsampling = jpge::H1V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V1)
                {
                    params.m_subsampling = jpge::H2V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V2)
                {
                    params.m_subsampling = jpge::H2V2;
                }

                success = jpge::compress_image_to_jpeg_file(pFilename, img.get_width(), img.get_height(), num_src_chans, (const jpge::uint8*)pSrc_img, params);
            }
            else
            {
                success = ((ext == "bmp" ? stbi_write_bmp : stbi_write_tga)(pFilename, img.get_width(), img.get_height(), num_src_chans, pSrc_img) == CRNLIB_TRUE);
            }
            return success;
        }